

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

int Acb_ObjSuppMin_int(Acb_Ntk_t *p,int iObj)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  int *piVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  char *__assertion;
  int iVar12;
  ulong uVar13;
  word *pwVar14;
  long lVar15;
  int *pFanins;
  uint *puVar16;
  long lVar17;
  bool bVar18;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    uVar1 = (p->vObjTruth).nSize;
    if (0 < (int)uVar1) {
      if (uVar1 <= (uint)iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjFans).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = (p->vObjFans).pArray[(uint)iObj];
      lVar17 = (long)iVar12;
      if ((lVar17 < 0) || ((p->vFanSto).nSize <= iVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      pwVar3 = (p->vObjTruth).pArray;
      piVar4 = (p->vFanSto).pArray;
      puVar16 = (uint *)(piVar4 + lVar17);
      uVar1 = *puVar16;
      uVar11 = 0;
      if (0 < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      uVar13 = pwVar3[(uint)iObj];
      puVar10 = s_Truths6Neg + 5;
      uVar9 = 0;
      pwVar14 = s_Truths6Neg;
      do {
        uVar8 = uVar9;
        if (uVar11 == uVar8) {
          return 0;
        }
        uVar9 = uVar8 + 1;
        puVar10 = puVar10 + 3;
        uVar5 = *pwVar14;
        pwVar14 = pwVar14 + 1;
      } while ((uVar5 & (uVar13 >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x3f) ^ uVar13)) != 0);
      uVar2 = puVar16[uVar9];
      lVar15 = (long)(int)uVar1 + -1;
      *puVar16 = (uint)lVar15;
      uVar11 = uVar8;
      if ((int)uVar8 < (int)(uint)lVar15) {
        do {
          piVar4[lVar17 + uVar11 + 1] = piVar4[lVar17 + uVar11 + 2];
          uVar11 = uVar11 + 1;
          lVar15 = (long)(int)*puVar16;
        } while ((long)uVar11 < lVar15);
      }
      puVar16[lVar15 + 1] = 0xffffffff;
      if (((int)uVar2 < 0) || ((p->vFanouts).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = (p->vFanouts).pArray;
      iVar12 = pVVar6[uVar2].nSize;
      if ((long)iVar12 < 1) {
        if (iVar12 != 0) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x3e5,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
      }
      else {
        piVar4 = pVVar6[uVar2].pArray;
        lVar17 = 1;
        do {
          if (piVar4[lVar17 + -1] == iObj) {
            if ((int)lVar17 < iVar12) {
              do {
                piVar4[lVar17 + -1] = piVar4[lVar17];
                lVar17 = lVar17 + 1;
                iVar12 = pVVar6[uVar2].nSize;
              } while ((int)lVar17 < iVar12);
            }
            pVVar6[uVar2].nSize = iVar12 + -1;
            break;
          }
          bVar18 = lVar17 != iVar12;
          lVar17 = lVar17 + 1;
        } while (bVar18);
      }
      if (uVar8 < 5) {
        do {
          bVar7 = (byte)(1 << ((char)uVar9 - 1U & 0x1f));
          uVar13 = (uVar13 & *puVar10) >> (bVar7 & 0x3f) |
                   (puVar10[-1] & uVar13) << (bVar7 & 0x3f) | puVar10[-2] & uVar13;
          puVar10 = puVar10 + 3;
          iVar12 = (int)uVar9;
          uVar9 = uVar9 + 1;
        } while (iVar12 != 5);
      }
      if (iObj < (p->vObjTruth).nSize) {
        pwVar3[(uint)iObj] = uVar13;
        return 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
    }
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjSuppMin_int( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins;
    word uTruth = Acb_ObjTruth( p, iObj );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Abc_Tt6HasVar(uTruth, k) )
            continue;
        Acb_ObjDeleteFaninIndex( p, iObj, k );
        Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
        Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruth, k) );
        return 1;
    }
    return 0;
}